

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int read_header(archive_read *a,archive_entry *entry,char head_type)

{
  char cVar1;
  int64_t iVar2;
  char __s [8];
  uint16_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  wchar_t wVar8;
  archive_string_conv *paVar9;
  undefined4 *puVar10;
  uLong uVar11;
  int64_t *buf;
  uchar *puVar12;
  time_t tVar13;
  uint64_t uVar14;
  void *pvVar15;
  ulong uVar16;
  char *pcVar17;
  size_t sVar18;
  data_block_offsets *pdVar19;
  int *piVar20;
  uint uVar21;
  uint uVar22;
  char local_e7;
  char local_e6;
  char local_e5;
  uint cp;
  uint8_t length;
  char high;
  char extra;
  uint offset;
  uint fn_end;
  uchar flagbyte;
  uchar flagbits;
  uchar highbyte;
  size_t newsize;
  char *newptr;
  size_t distance;
  int ret2;
  int ret;
  unsigned_long crc32_val;
  archive_string_conv *fn_sconv;
  archive_string_conv *sconv;
  undefined4 local_98;
  int ttime;
  char unp_size [8];
  char packed_size [8];
  char *strp;
  char *filename;
  uint end;
  uint filename_size;
  int64_t header_size;
  rar_file_header file_header;
  rar_header rar_header;
  rar *rar;
  char *endp;
  char *p;
  void *h;
  char head_type_local;
  archive_entry *entry_local;
  archive_read *a_local;
  
  distance._4_4_ = 0;
  unique0x00012000 = (rar *)a->format->data;
  fn_sconv = unique0x00012000->opt_sconv;
  if (fn_sconv == (archive_string_conv *)0x0) {
    if (unique0x00012000->init_default_conversion == 0) {
      paVar9 = archive_string_default_conversion_for_read(&a->archive);
      stack0xffffffffffffffb8->sconv_default = paVar9;
      stack0xffffffffffffffb8->init_default_conversion = 1;
    }
    fn_sconv = stack0xffffffffffffffb8->sconv_default;
  }
  puVar10 = (undefined4 *)__archive_read_ahead(a,7,(ssize_t *)0x0);
  if (puVar10 == (undefined4 *)0x0) {
    a_local._4_4_ = -0x1e;
  }
  else {
    file_header._17_4_ = *puVar10;
    file_header.file_attr._0_2_ = *(undefined2 *)(puVar10 + 1);
    file_header.file_attr[2] = *(char *)((long)puVar10 + 6);
    uVar3 = archive_le16dec(file_header.name_size + 1);
    stack0xffffffffffffffb8->file_flags = (uint)uVar3;
    uVar3 = archive_le16dec(file_header.file_attr + 1);
    _end = (ulong)uVar3;
    if (_end < 0x20) {
      archive_set_error(&a->archive,0x54,"Invalid header size");
      a_local._4_4_ = -0x1e;
    }
    else {
      uVar11 = cm_zlib_z_crc32(0,(uchar *)((long)puVar10 + 2),5);
      __archive_read_consume(a,7);
      if ((stack0xffffffffffffffb8->file_flags & 0x10) == 0) {
        stack0xffffffffffffffb8->compression_method = '\0';
        stack0xffffffffffffffb8->packed_size = 0;
        stack0xffffffffffffffb8->unp_size = 0;
        stack0xffffffffffffffb8->mtime = 0;
        stack0xffffffffffffffb8->ctime = 0;
        stack0xffffffffffffffb8->atime = 0;
        stack0xffffffffffffffb8->arctime = 0;
        stack0xffffffffffffffb8->mode = 0;
        memset(stack0xffffffffffffffb8->salt,0,8);
        stack0xffffffffffffffb8->atime = 0;
        stack0xffffffffffffffb8->ansec = 0;
        stack0xffffffffffffffb8->ctime = 0;
        stack0xffffffffffffffb8->cnsec = 0;
        stack0xffffffffffffffb8->mtime = 0;
        stack0xffffffffffffffb8->mnsec = 0;
        stack0xffffffffffffffb8->arctime = 0;
        stack0xffffffffffffffb8->arcnsec = 0;
        buf = (int64_t *)__archive_read_ahead(a,_end - 7,(ssize_t *)0x0);
        if (buf == (int64_t *)0x0) {
          a_local._4_4_ = -0x1e;
        }
        else {
          uVar11 = cm_zlib_z_crc32(uVar11,(uchar *)buf,uVar3 - 7);
          uVar3 = archive_le16dec(&file_header.unp_ver);
          if ((uVar11 & 0xffff) == (ulong)uVar3) {
            puVar12 = (uchar *)((long)buf + _end);
            header_size = *buf;
            file_header._0_8_ = buf[1];
            iVar2 = buf[2];
            file_header.file_time[3] = (char)buf[3];
            endp = (char *)((long)buf + 0x19);
            file_header.file_crc[1] = (char)((ulong)iVar2 >> 0x10);
            stack0xffffffffffffffb8->compression_method = file_header.file_crc[1];
            file_header._8_8_ = iVar2;
            uVar4 = archive_le32dec(file_header.unp_size + 1);
            tVar13 = get_time(uVar4);
            stack0xffffffffffffffb8->mtime = tVar13;
            uVar4 = archive_le32dec(file_header.pack_size + 1);
            stack0xffffffffffffffb8->file_crc = (ulong)uVar4;
            if ((stack0xffffffffffffffb8->file_flags & 4) != 0) {
              archive_entry_set_is_data_encrypted(entry,'\x01');
              stack0xffffffffffffffb8->has_encrypted_entries = 1;
              archive_set_error(&a->archive,0x54,"RAR encryption support unavailable.");
            }
            iVar2 = header_size;
            if ((stack0xffffffffffffffb8->file_flags & 0x100) == 0) {
              uVar4 = archive_le32dec(&header_size);
              stack0xffffffffffffffb8->packed_size = (ulong)uVar4;
              uVar4 = archive_le32dec((void *)((long)&header_size + 4));
              stack0xffffffffffffffb8->unp_size = (ulong)uVar4;
            }
            else {
              unp_size[0] = (char)header_size;
              unp_size[1] = header_size._1_1_;
              unp_size[2] = header_size._2_1_;
              unp_size[3] = header_size._3_1_;
              unp_size._4_4_ = *(undefined4 *)endp;
              header_size._4_4_ = SUB84(iVar2,4);
              local_98 = header_size._4_4_;
              ttime = *(int *)((long)buf + 0x1d);
              endp = (char *)((long)buf + 0x21);
              header_size = iVar2;
              uVar14 = archive_le64dec(unp_size);
              stack0xffffffffffffffb8->packed_size = uVar14;
              uVar14 = archive_le64dec(&local_98);
              stack0xffffffffffffffb8->unp_size = uVar14;
            }
            if ((stack0xffffffffffffffb8->packed_size < 0) ||
               (stack0xffffffffffffffb8->unp_size < 0)) {
              archive_set_error(&a->archive,0x54,"Invalid sizes specified.");
              a_local._4_4_ = -0x1e;
            }
            else {
              stack0xffffffffffffffb8->bytes_remaining = stack0xffffffffffffffb8->packed_size;
              if (head_type == 'z') {
                _end = stack0xffffffffffffffb8->packed_size + _end;
                pvVar15 = __archive_read_ahead(a,_end - 7,(ssize_t *)0x0);
                if (pvVar15 == (void *)0x0) {
                  return -0x1e;
                }
                puVar12 = (uchar *)((long)pvVar15 + _end);
                endp = (char *)(((long)endp - (long)buf) + (long)pvVar15);
              }
              rar = (rar *)(puVar12 + -7);
              uVar3 = archive_le16dec(file_header.file_crc + 2);
              uVar21 = (uint)uVar3;
              if (rar < (rar *)(endp + uVar21)) {
                archive_set_error(&a->archive,0x54,"Invalid filename size");
                a_local._4_4_ = -0x1e;
              }
              else {
                if (stack0xffffffffffffffb8->filename_allocated < (ulong)(uVar21 * 2 + 2)) {
                  uVar16 = (ulong)(uVar21 * 2 + 2);
                  pcVar17 = (char *)realloc(stack0xffffffffffffffb8->filename,uVar16);
                  if (pcVar17 == (char *)0x0) {
                    archive_set_error(&a->archive,0xc,"Couldn\'t allocate memory.");
                    return -0x1e;
                  }
                  stack0xffffffffffffffb8->filename = pcVar17;
                  stack0xffffffffffffffb8->filename_allocated = uVar16;
                }
                __s = (char  [8])stack0xffffffffffffffb8->filename;
                memcpy((void *)__s,endp,(ulong)uVar21);
                *(char *)((long)__s + (ulong)uVar21) = '\0';
                cp = uVar21;
                filename._4_4_ = uVar21;
                if ((stack0xffffffffffffffb8->file_flags & 0x200) == 0) {
                  crc32_val = (unsigned_long)fn_sconv;
                  while (pcVar17 = strchr((char *)__s,0x5c), pcVar17 != (char *)0x0) {
                    *pcVar17 = '/';
                  }
                }
                else {
                  sVar18 = strlen((char *)__s);
                  if (uVar21 == sVar18) {
                    if (stack0xffffffffffffffb8->sconv_utf8 == (archive_string_conv *)0x0) {
                      paVar9 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
                      stack0xffffffffffffffb8->sconv_utf8 = paVar9;
                      if (stack0xffffffffffffffb8->sconv_utf8 == (archive_string_conv *)0x0) {
                        return -0x1e;
                      }
                    }
                    crc32_val = (unsigned_long)stack0xffffffffffffffb8->sconv_utf8;
                    while (pcVar17 = strchr((char *)__s,0x5c), pcVar17 != (char *)0x0) {
                      *pcVar17 = '/';
                    }
                  }
                  else {
                    uVar5 = uVar21 << 1;
                    filename._4_4_ = 0;
                    sVar18 = strlen((char *)__s);
                    cVar1 = endp[(int)sVar18 + 1];
                    offset._2_1_ = 0;
                    offset._1_1_ = 0;
                    cp = (int)sVar18 + 2;
                    while (cp < uVar21 && filename._4_4_ < uVar5) {
                      if (offset._2_1_ == 0) {
                        offset._1_1_ = endp[cp];
                        offset._2_1_ = 8;
                        cp = cp + 1;
                      }
                      offset._2_1_ = offset._2_1_ - 2;
                      switch(offset._1_1_ >> (offset._2_1_ & 0x1f) & 3) {
                      case 0:
                        uVar6 = filename._4_4_ + 1;
                        *(char *)((long)__s + (ulong)filename._4_4_) = '\0';
                        filename._4_4_ = filename._4_4_ + 2;
                        *(char *)((long)__s + (ulong)uVar6) = endp[cp];
                        cp = cp + 1;
                        break;
                      case 1:
                        uVar6 = filename._4_4_ + 1;
                        *(char *)((long)__s + (ulong)filename._4_4_) = cVar1;
                        filename._4_4_ = filename._4_4_ + 2;
                        *(char *)((long)__s + (ulong)uVar6) = endp[cp];
                        cp = cp + 1;
                        break;
                      case 2:
                        uVar6 = filename._4_4_ + 1;
                        *(char *)((long)__s + (ulong)filename._4_4_) = endp[(ulong)cp + 1];
                        filename._4_4_ = filename._4_4_ + 2;
                        *(char *)((long)__s + (ulong)uVar6) = endp[cp];
                        cp = cp + 2;
                        break;
                      case 3:
                        uVar16 = (ulong)cp;
                        if ((endp[uVar16] & 0x80U) == 0) {
                          local_e6 = '\0';
                          local_e5 = '\0';
                          cp = cp + 1;
                        }
                        else {
                          local_e5 = endp[cp + 1];
                          local_e6 = cVar1;
                          cp = cp + 2;
                        }
                        for (local_e7 = (endp[uVar16] & 0x7fU) + 2;
                            local_e7 != '\0' && filename._4_4_ < uVar5; local_e7 = local_e7 + -1) {
                          uVar6 = filename._4_4_ >> 1;
                          uVar22 = filename._4_4_ + 1;
                          *(char *)((long)__s + (ulong)filename._4_4_) = local_e6;
                          filename._4_4_ = filename._4_4_ + 2;
                          *(char *)((long)__s + (ulong)uVar22) = endp[uVar6] + local_e5;
                        }
                      }
                    }
                    if (uVar5 < filename._4_4_) {
                      archive_set_error(&a->archive,0x54,"Invalid filename");
                      return -0x1e;
                    }
                    uVar21 = filename._4_4_ + 1;
                    *(char *)((long)__s + (ulong)filename._4_4_) = '\0';
                    *(char *)((long)__s + (ulong)uVar21) = '\0';
                    if (stack0xffffffffffffffb8->sconv_utf16be == (archive_string_conv *)0x0) {
                      paVar9 = archive_string_conversion_from_charset
                                         (&a->archive,"UTF-16BE",L'\x01');
                      stack0xffffffffffffffb8->sconv_utf16be = paVar9;
                      if (stack0xffffffffffffffb8->sconv_utf16be == (archive_string_conv *)0x0) {
                        return -0x1e;
                      }
                    }
                    crc32_val = (unsigned_long)stack0xffffffffffffffb8->sconv_utf16be;
                    for (packed_size = __s; filename._4_4_ = uVar21, *(short *)packed_size != 0;
                        packed_size = (char  [8])((long)packed_size + 2)) {
                      if (*(short *)packed_size == 0x5c00) {
                        *(undefined1 *)((long)packed_size + 1) = 0x2f;
                      }
                    }
                  }
                }
                endp = endp + cp;
                if (((stack0xffffffffffffffb8->filename_save == (char *)0x0) ||
                    ((ulong)filename._4_4_ != stack0xffffffffffffffb8->filename_save_size)) ||
                   (iVar7 = memcmp(stack0xffffffffffffffb8->filename,
                                   stack0xffffffffffffffb8->filename_save,
                                   (ulong)(filename._4_4_ + 1)), iVar7 != 0)) {
                  if (stack0xffffffffffffffb8->filename_must_match == '\0') {
                    pcVar17 = (char *)realloc(stack0xffffffffffffffb8->filename_save,
                                              (ulong)(filename._4_4_ + 1));
                    stack0xffffffffffffffb8->filename_save = pcVar17;
                    memcpy(stack0xffffffffffffffb8->filename_save,stack0xffffffffffffffb8->filename,
                           (ulong)(filename._4_4_ + 1));
                    stack0xffffffffffffffb8->filename_save_size = (ulong)filename._4_4_;
                    free(stack0xffffffffffffffb8->dbo);
                    pdVar19 = (data_block_offsets *)calloc(1,0x18);
                    stack0xffffffffffffffb8->dbo = pdVar19;
                    if (pdVar19 == (data_block_offsets *)0x0) {
                      archive_set_error(&a->archive,0xc,"Couldn\'t allocate memory.");
                      a_local._4_4_ = -0x1e;
                    }
                    else {
                      stack0xffffffffffffffb8->dbo->header_size = _end;
                      stack0xffffffffffffffb8->dbo->start_offset = -1;
                      stack0xffffffffffffffb8->dbo->end_offset = -1;
                      stack0xffffffffffffffb8->cursor = 0;
                      stack0xffffffffffffffb8->nodes = 1;
                      if ((stack0xffffffffffffffb8->file_flags & 0x400) != 0) {
                        if (rar < (rar *)(endp + 8)) {
                          archive_set_error(&a->archive,0x54,"Invalid header size");
                          return -0x1e;
                        }
                        *(undefined8 *)stack0xffffffffffffffb8->salt = *(undefined8 *)endp;
                        endp = endp + 8;
                      }
                      if (((stack0xffffffffffffffb8->file_flags & 0x1000) == 0) ||
                         (iVar7 = read_exttime(endp,stack0xffffffffffffffb8,(char *)rar), -1 < iVar7
                         )) {
                        __archive_read_consume(a,_end - 7);
                        stack0xffffffffffffffb8->dbo->start_offset = a->filter->position;
                        stack0xffffffffffffffb8->dbo->end_offset =
                             stack0xffffffffffffffb8->dbo->start_offset +
                             stack0xffffffffffffffb8->packed_size;
                        if ((uint)(int)file_header.pack_size[0] < 3) {
                          uVar4 = archive_le32dec(file_header.file_time);
                          stack0xffffffffffffffb8->mode = uVar4;
                          if ((stack0xffffffffffffffb8->mode & 0x10) == 0) {
                            stack0xffffffffffffffb8->mode = 0x8000;
                          }
                          else {
                            stack0xffffffffffffffb8->mode = 0x4049;
                          }
                          stack0xffffffffffffffb8->mode = stack0xffffffffffffffb8->mode | 0x1a4;
                        }
                        else {
                          if (2 < (int)file_header.pack_size[0] - 3U) {
                            archive_set_error(&a->archive,0x54,
                                              "Unknown file attributes from RAR file\'s host OS");
                            return -0x1e;
                          }
                          uVar4 = archive_le32dec(file_header.file_time);
                          stack0xffffffffffffffb8->mode = uVar4;
                        }
                        stack0xffffffffffffffb8->bytes_unconsumed = 0;
                        stack0xffffffffffffffb8->bytes_uncopied = 0;
                        stack0xffffffffffffffb8->offset = 0;
                        (stack0xffffffffffffffb8->lzss).position = 0;
                        stack0xffffffffffffffb8->offset_seek = 0;
                        stack0xffffffffffffffb8->dictionary_size = 0;
                        stack0xffffffffffffffb8->offset_outgoing = 0;
                        (stack0xffffffffffffffb8->br).cache_avail = 0;
                        (stack0xffffffffffffffb8->br).avail_in = 0;
                        stack0xffffffffffffffb8->crc_calculated = 0;
                        stack0xffffffffffffffb8->entry_eof = '\0';
                        stack0xffffffffffffffb8->valid = '\x01';
                        stack0xffffffffffffffb8->is_ppmd_block = '\0';
                        stack0xffffffffffffffb8->start_new_table = '\x01';
                        free(stack0xffffffffffffffb8->unp_buffer);
                        stack0xffffffffffffffb8->unp_buffer = (uchar *)0x0;
                        stack0xffffffffffffffb8->unp_offset = 0;
                        stack0xffffffffffffffb8->unp_buffer_size = 0x20000;
                        memset(stack0xffffffffffffffb8->lengthtable,0,0x194);
                        Ppmd7_Free(&stack0xffffffffffffffb8->ppmd7_context);
                        stack0xffffffffffffffb8->ppmd_eod = '\0';
                        stack0xffffffffffffffb8->ppmd_valid = '\0';
                        (stack0xffffffffffffffb8->filters).filterstart = 0x7fffffffffffffff;
                        if (head_type == 'z') {
                          a_local._4_4_ = 0;
                        }
                        else {
                          archive_entry_set_mtime
                                    (entry,stack0xffffffffffffffb8->mtime,
                                     stack0xffffffffffffffb8->mnsec);
                          archive_entry_set_ctime
                                    (entry,stack0xffffffffffffffb8->ctime,
                                     stack0xffffffffffffffb8->cnsec);
                          archive_entry_set_atime
                                    (entry,stack0xffffffffffffffb8->atime,
                                     stack0xffffffffffffffb8->ansec);
                          archive_entry_set_size(entry,stack0xffffffffffffffb8->unp_size);
                          archive_entry_set_mode(entry,stack0xffffffffffffffb8->mode);
                          wVar8 = _archive_entry_copy_pathname_l
                                            (entry,(char *)__s,(ulong)filename._4_4_,
                                             (archive_string_conv *)crc32_val);
                          if (wVar8 != L'\0') {
                            piVar20 = __errno_location();
                            if (*piVar20 == 0xc) {
                              archive_set_error(&a->archive,0xc,
                                                "Can\'t allocate memory for Pathname");
                              return -0x1e;
                            }
                            pcVar17 = archive_string_conversion_charset_name
                                                ((archive_string_conv *)crc32_val);
                            archive_set_error(&a->archive,0x54,
                                              "Pathname cannot be converted from %s to current locale."
                                              ,pcVar17);
                            distance._4_4_ = -0x14;
                          }
                          if ((stack0xffffffffffffffb8->mode & 0xf000) == 0xa000) {
                            stack0xffffffffffffffb8->bytes_remaining = 0;
                            archive_entry_set_size(entry,0);
                            iVar7 = read_symlink_stored(a,entry,fn_sconv);
                            if (iVar7 < -0x14) {
                              return iVar7;
                            }
                            if (iVar7 < distance._4_4_) {
                              distance._4_4_ = iVar7;
                            }
                          }
                          if (stack0xffffffffffffffb8->bytes_remaining == 0) {
                            stack0xffffffffffffffb8->entry_eof = '\x01';
                          }
                          a_local._4_4_ = distance._4_4_;
                        }
                      }
                      else {
                        archive_set_error(&a->archive,0x54,"Invalid header size");
                        a_local._4_4_ = -0x1e;
                      }
                    }
                  }
                  else {
                    archive_set_error(&a->archive,0x54,
                                      "Mismatch of file parts split across multi-volume archive");
                    a_local._4_4_ = -0x1e;
                  }
                }
                else {
                  __archive_read_consume(a,_end - 7);
                  stack0xffffffffffffffb8->cursor = stack0xffffffffffffffb8->cursor + 1;
                  if (stack0xffffffffffffffb8->nodes <= stack0xffffffffffffffb8->cursor) {
                    stack0xffffffffffffffb8->nodes = stack0xffffffffffffffb8->nodes + 1;
                    pdVar19 = (data_block_offsets *)
                              realloc(stack0xffffffffffffffb8->dbo,
                                      (ulong)stack0xffffffffffffffb8->nodes * 0x18);
                    stack0xffffffffffffffb8->dbo = pdVar19;
                    if (pdVar19 == (data_block_offsets *)0x0) {
                      archive_set_error(&a->archive,0xc,"Couldn\'t allocate memory.");
                      return -0x1e;
                    }
                    stack0xffffffffffffffb8->dbo[stack0xffffffffffffffb8->cursor].header_size = _end
                    ;
                    stack0xffffffffffffffb8->dbo[stack0xffffffffffffffb8->cursor].start_offset = -1;
                    stack0xffffffffffffffb8->dbo[stack0xffffffffffffffb8->cursor].end_offset = -1;
                  }
                  if (stack0xffffffffffffffb8->dbo[stack0xffffffffffffffb8->cursor].start_offset < 0
                     ) {
                    stack0xffffffffffffffb8->dbo[stack0xffffffffffffffb8->cursor].start_offset =
                         a->filter->position;
                    stack0xffffffffffffffb8->dbo[stack0xffffffffffffffb8->cursor].end_offset =
                         stack0xffffffffffffffb8->dbo[stack0xffffffffffffffb8->cursor].start_offset
                         + stack0xffffffffffffffb8->packed_size;
                  }
                  a_local._4_4_ = 0;
                }
              }
            }
          }
          else {
            archive_set_error(&a->archive,0x54,"Header CRC error");
            a_local._4_4_ = -0x1e;
          }
        }
      }
      else {
        archive_set_error(&a->archive,0x54,"RAR solid archive support unavailable.");
        a_local._4_4_ = -0x1e;
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct mtree *mtree;
	char *p;
	int r, use_next;

	mtree = (struct mtree *)(a->format->data);

	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}

	if (mtree->entries == NULL) {
		mtree->resolver = archive_entry_linkresolver_new();
		if (mtree->resolver == NULL)
			return ARCHIVE_FATAL;
		archive_entry_linkresolver_set_strategy(mtree->resolver,
		    ARCHIVE_FORMAT_MTREE);
		r = read_mtree(a, mtree);
		if (r != ARCHIVE_OK)
			return (r);
	}

	a->archive.archive_format = mtree->archive_format;
	a->archive.archive_format_name = mtree->archive_format_name;

	for (;;) {
		if (mtree->this_entry == NULL)
			return (ARCHIVE_EOF);
		if (strcmp(mtree->this_entry->name, "..") == 0) {
			mtree->this_entry->used = 1;
			if (archive_strlen(&mtree->current_dir) > 0) {
				/* Roll back current path. */
				p = mtree->current_dir.s
				    + mtree->current_dir.length - 1;
				while (p >= mtree->current_dir.s && *p != '/')
					--p;
				if (p >= mtree->current_dir.s)
					--p;
				mtree->current_dir.length
				    = p - mtree->current_dir.s + 1;
			}
		}
		if (!mtree->this_entry->used) {
			use_next = 0;
			r = parse_file(a, entry, mtree, mtree->this_entry,
				&use_next);
			if (use_next == 0)
				return (r);
		}
		mtree->this_entry = mtree->this_entry->next;
	}
}